

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O1

void __thiscall RootIndexProxyModel::~RootIndexProxyModel(RootIndexProxyModel *this)

{
  RootIndexProxyModelPrivate *pRVar1;
  Data *pDVar2;
  Connection *pCVar3;
  
  *(undefined ***)this = &PTR_metaObject_00167410;
  pRVar1 = this->m_dptr;
  if ((pRVar1->m_sourceConnections).d.size != 0) {
    pCVar3 = (pRVar1->m_sourceConnections).d.ptr;
    do {
      QObject::disconnect(pCVar3);
      pCVar3 = pCVar3 + 1;
    } while (pCVar3 != (pRVar1->m_sourceConnections).d.ptr + (pRVar1->m_sourceConnections).d.size);
  }
  pRVar1 = this->m_dptr;
  if (pRVar1 != (RootIndexProxyModelPrivate *)0x0) {
    pDVar2 = (pRVar1->proxyIndexes).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pRVar1->proxyIndexes).d.d)->super_QArrayData,0x18,8);
      }
    }
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
              (&(pRVar1->layoutChangePersistentIndexes).d);
    QPersistentModelIndex::~QPersistentModelIndex(&pRVar1->m_rootIndex);
    QArrayDataPointer<QMetaObject::Connection>::~QArrayDataPointer
              ((QArrayDataPointer<QMetaObject::Connection> *)pRVar1);
    operator_delete(pRVar1,0x60);
  }
  QIdentityProxyModel::~QIdentityProxyModel(&this->super_QIdentityProxyModel);
  return;
}

Assistant:

RootIndexProxyModel::~RootIndexProxyModel()
{
    Q_D(RootIndexProxyModel);
    for (auto discIter = d->m_sourceConnections.cbegin(); discIter != d->m_sourceConnections.cend(); ++discIter)
        QObject::disconnect(*discIter);
    delete m_dptr;
}